

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O0

void history_lose_artifact(player *p,artifact *artifact)

{
  _Bool _Var1;
  bitflag local_ba [2];
  char local_b8 [6];
  bitflag flags [2];
  char text [80];
  char o_name [80];
  artifact *artifact_local;
  player *p_local;
  
  if (artifact != (artifact *)0x0) {
    _Var1 = history_mark_artifact_lost(&p->hist,artifact);
    if (!_Var1) {
      get_artifact_name(text + 0x48,0x50,artifact);
      strnfmt(local_b8,0x50,"Missed %s",text + 0x48);
      flag_wipe(local_ba,2);
      flag_on_dbg(local_ba,2,2,"flags","HIST_ARTIFACT_UNKNOWN");
      flag_on_dbg(local_ba,2,4,"flags","HIST_ARTIFACT_LOST");
      history_add_with_flags(p,local_b8,local_ba,artifact);
    }
    return;
  }
  __assert_fail("artifact != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-history.c"
                ,0xf8,"void history_lose_artifact(struct player *, const struct artifact *)");
}

Assistant:

void history_lose_artifact(struct player *p, const struct artifact *artifact)
{
	assert(artifact != NULL);

	/* Try to mark it as lost if it's already in history */
	if (!history_mark_artifact_lost(&p->hist, artifact)) {
		/* Otherwise add a new entry */
		char o_name[80];
		char text[80];

		get_artifact_name(o_name, sizeof(o_name), artifact);
		strnfmt(text, sizeof(text), "Missed %s", o_name);

		bitflag flags[HIST_SIZE];
		hist_wipe(flags);
		hist_on(flags, HIST_ARTIFACT_UNKNOWN);
		hist_on(flags, HIST_ARTIFACT_LOST);

		history_add_with_flags(p, text, flags, artifact);
	}
}